

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
          (QMovableArrayOps<QCss::Declaration> *this,qsizetype i,Declaration *args)

{
  Declaration **ppDVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  Declaration *pDVar5;
  DeclarationData *pDVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Declaration tmp;
  Declaration local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCss::Declaration>).
           super_QArrayDataPointer<QCss::Declaration>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0038cd1d:
    local_30 = (Declaration)(args->d).d.ptr;
    if (local_30.d.d.ptr != (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0) {
      LOCK();
      *(int *)local_30.d.d.ptr = *(int *)local_30.d.d.ptr + 1;
      UNLOCK();
    }
    bVar7 = (this->super_QGenericArrayOps<QCss::Declaration>).
            super_QArrayDataPointer<QCss::Declaration>.size != 0;
    QArrayDataPointer<QCss::Declaration>::detachAndGrow
              ((QArrayDataPointer<QCss::Declaration> *)this,(uint)(i == 0 && bVar7),1,
               (Declaration **)0x0,(QArrayDataPointer<QCss::Declaration> *)0x0);
    pDVar5 = (this->super_QGenericArrayOps<QCss::Declaration>).
             super_QArrayDataPointer<QCss::Declaration>.ptr;
    if (i == 0 && bVar7) {
      pDVar5[-1].d.d.ptr = (DeclarationData *)local_30.d.d.ptr;
      ppDVar1 = &(this->super_QGenericArrayOps<QCss::Declaration>).
                 super_QArrayDataPointer<QCss::Declaration>.ptr;
      *ppDVar1 = *ppDVar1 + -1;
    }
    else {
      memmove(pDVar5 + i + 1,pDVar5 + i,
              ((this->super_QGenericArrayOps<QCss::Declaration>).
               super_QArrayDataPointer<QCss::Declaration>.size - i) * 8);
      pDVar5[i].d.d.ptr = (DeclarationData *)local_30.d.d.ptr;
    }
    local_30.d.d.ptr =
         (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
         (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::Declaration>).
              super_QArrayDataPointer<QCss::Declaration>.size;
    *pqVar2 = *pqVar2 + 1;
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::~QExplicitlySharedDataPointer
              (&local_30.d);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QCss::Declaration>).
            super_QArrayDataPointer<QCss::Declaration>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QCss::Declaration>).
                      super_QArrayDataPointer<QCss::Declaration>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      pDVar6 = (args->d).d.ptr;
      (this->super_QGenericArrayOps<QCss::Declaration>).super_QArrayDataPointer<QCss::Declaration>.
      ptr[lVar4].d.d.ptr = pDVar6;
      if (pDVar6 != (DeclarationData *)0x0) {
        LOCK();
        (pDVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pDVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((Declaration *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QCss::Declaration>).
          super_QArrayDataPointer<QCss::Declaration>.ptr)) goto LAB_0038cd1d;
      pDVar6 = (args->d).d.ptr;
      (this->super_QGenericArrayOps<QCss::Declaration>).super_QArrayDataPointer<QCss::Declaration>.
      ptr[-1].d.d.ptr = pDVar6;
      if (pDVar6 != (DeclarationData *)0x0) {
        LOCK();
        (pDVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pDVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      ppDVar1 = &(this->super_QGenericArrayOps<QCss::Declaration>).
                 super_QArrayDataPointer<QCss::Declaration>.ptr;
      *ppDVar1 = *ppDVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QCss::Declaration>).
              super_QArrayDataPointer<QCss::Declaration>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }